

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

bool __thiscall
cmTarget::GetMappedConfig
          (cmTarget *this,string *desired_config,cmValue *loc,cmValue *imp,string *suffix)

{
  int iVar1;
  long *plVar2;
  pointer pbVar3;
  pointer pbVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  cmValue cVar9;
  char *pcVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  string *psVar12;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_07;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_08;
  string mcUpper;
  string mapProp;
  cmList mappedConfigs;
  string locProp;
  string locPropBase;
  cmList availableConfigs;
  string config_upper;
  undefined1 local_178 [32];
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  undefined8 local_130;
  size_type local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  undefined8 local_118;
  undefined1 local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  string *local_e8;
  container_type local_d8;
  undefined1 local_b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 local_78 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  size_type local_48;
  char local_40;
  undefined7 uStack_3f;
  
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40;
  local_48 = 0;
  local_40 = '\0';
  if (desired_config->_M_string_length != 0) {
    cmsys::SystemTools::UpperCase(&local_158,desired_config);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
  }
  local_98._M_allocated_capacity = (size_type)&local_88;
  local_98._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_88._M_local_buf[0] = '\0';
  iVar1 = ((this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType;
  if (iVar1 == 4) {
    pcVar10 = "IMPORTED_OBJECTS";
  }
  else if (iVar1 == 7) {
    pcVar10 = "IMPORTED_LIBNAME";
  }
  else {
    pcVar10 = "IMPORTED_LOCATION";
  }
  std::__cxx11::string::_M_replace((ulong)&local_98,0,(char *)0x0,(ulong)pcVar10);
  local_158.field_2._M_allocated_capacity = (long)&local_158.field_2 + 8;
  local_158._M_dataplus._M_p = (pointer)0x0;
  local_158._M_string_length = 1;
  local_158.field_2._M_local_buf[8] = 0x5f;
  local_110._0_8_ = &DAT_00000001;
  local_110._16_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_110._24_8_ = local_48;
  local_f0 = local_50;
  local_e8 = (string *)0x0;
  views._M_len = 2;
  views._M_array = (iterator)local_110;
  local_110._8_8_ = local_158.field_2._M_allocated_capacity;
  cmCatViews((string *)local_178,views);
  std::__cxx11::string::operator=((string *)suffix,(string *)local_178);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_178 + 0x10)) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
  }
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_158._M_dataplus._M_p = (pointer)0x14;
  local_158._M_string_length = 0x945eb0;
  local_158.field_2._M_allocated_capacity = 0;
  local_158.field_2._8_8_ = local_48;
  local_138 = local_50;
  local_130 = 0;
  views_00._M_len = 2;
  views_00._M_array = (iterator)&local_158;
  cmCatViews((string *)local_110,views_00);
  cVar9 = GetProperty(this,(string *)local_110);
  pbVar4 = local_d8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar3 = local_d8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (cVar9.Value != (string *)0x0) {
    if (local_d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      paVar11 = &(local_d8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->field_2;
      do {
        plVar2 = (long *)(((string *)(paVar11 + -1))->_M_dataplus)._M_p;
        if (paVar11 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar2) {
          operator_delete(plVar2,paVar11->_M_allocated_capacity + 1);
        }
        psVar12 = (string *)(paVar11 + 1);
        paVar11 = paVar11 + 2;
      } while (psVar12 != pbVar4);
      local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
    }
    cmList::Insert(&local_d8,
                   (const_iterator)
                   local_d8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,cVar9.Value,Yes,Yes);
  }
  if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
    operator_delete((void *)local_110._0_8_,(ulong)(local_110._16_8_ + 1));
  }
  bVar8 = true;
  if (((((this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType != 2) &&
      (bVar7 = IsExecutableWithExports(this), !bVar7)) &&
     ((((this->impl)._M_t.
        super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
        super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
        super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsAIX != true ||
      (bVar7 = IsExecutableWithExports(this), !bVar7)))) {
    bVar8 = cmMakefile::PlatformSupportsAppleTextStubs
                      (((this->impl)._M_t.
                        super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                        .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
    if (bVar8) {
      bVar8 = IsSharedLibraryWithExports(this);
    }
    else {
      bVar8 = false;
    }
  }
  bVar7 = loc->Value != (string *)0x0;
  if (((!bVar7) && (imp->Value == (string *)0x0)) &&
     (psVar12 = local_d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
     local_d8.
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start !=
     local_d8.
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    do {
      if (psVar12->_M_string_length == 0) {
        cVar9 = GetProperty(this,(string *)&local_98);
        loc->Value = (string *)cVar9;
        if (bVar8 != false) {
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"IMPORTED_IMPLIB","")
          ;
          cVar9 = GetProperty(this,&local_158);
          imp->Value = (string *)cVar9;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,
                            (ulong)(local_158.field_2._M_allocated_capacity + 1));
          }
        }
        if (imp->Value != (string *)0x0 || loc->Value != (string *)0x0) {
          suffix->_M_string_length = 0;
          *(suffix->_M_dataplus)._M_p = '\0';
        }
      }
      else {
        cmsys::SystemTools::UpperCase((string *)local_178,psVar12);
        local_158._M_dataplus._M_p = (pointer)local_98._8_8_;
        local_158._M_string_length = local_98._M_allocated_capacity;
        local_158.field_2._M_allocated_capacity = 0;
        local_110._0_8_ = (pointer)0x0;
        local_110._8_8_ = &DAT_00000001;
        local_138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_110 + 0x18);
        local_110[0x18] = 0x5f;
        local_158.field_2._8_8_ = 1;
        local_130 = 0;
        local_128 = local_178._8_8_;
        local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_178._0_8_;
        local_118 = 0;
        views_01._M_len = 3;
        views_01._M_array = (iterator)&local_158;
        local_110._16_8_ = local_138;
        cmCatViews((string *)local_b8,views_01);
        cVar9 = GetProperty(this,(string *)local_b8);
        loc->Value = (string *)cVar9;
        if (bVar8 != false) {
          local_158._M_dataplus._M_p = (pointer)0x10;
          local_158._M_string_length = 0x946b8e;
          local_158.field_2._M_allocated_capacity = 0;
          local_158.field_2._8_8_ = local_178._8_8_;
          local_138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_178._0_8_;
          local_130 = 0;
          views_02._M_len = 2;
          views_02._M_array = (iterator)&local_158;
          cmCatViews((string *)local_110,views_02);
          cVar9 = GetProperty(this,(string *)local_110);
          imp->Value = (string *)cVar9;
          if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
            operator_delete((void *)local_110._0_8_,(ulong)(local_110._16_8_ + 1));
          }
        }
        if (imp->Value != (string *)0x0 || loc->Value != (string *)0x0) {
          local_158._M_dataplus._M_p = (pointer)0x0;
          local_158._M_string_length = (size_type)&DAT_00000001;
          local_158.field_2._M_allocated_capacity = (long)&local_158.field_2 + 8;
          local_158.field_2._M_local_buf[8] = 0x5f;
          local_110._0_8_ = &DAT_00000001;
          local_110._16_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_110._24_8_ = local_178._8_8_;
          local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_178._0_8_;
          local_e8 = (string *)0x0;
          views_03._M_len = 2;
          views_03._M_array = (iterator)local_110;
          local_110._8_8_ = local_158.field_2._M_allocated_capacity;
          cmCatViews((string *)local_78,views_03);
          std::__cxx11::string::operator=((string *)suffix,(string *)local_78);
          if ((string *)local_78._0_8_ != (string *)(local_78 + 0x10)) {
            operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b8 + 0x10))
        {
          operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_178 + 0x10))
        {
          operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
        }
      }
      bVar7 = loc->Value != (string *)0x0;
    } while (((!bVar7) && (imp->Value == (string *)0x0)) &&
            (psVar12 = psVar12 + 1,
            psVar12 !=
            local_d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish));
  }
  if (((bVar7) ||
      (local_d8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       local_d8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) || (imp->Value != (string *)0x0)) {
    if (!(bool)(bVar7 | imp->Value != (string *)0x0)) {
      local_158._M_dataplus._M_p = (pointer)local_98._8_8_;
      local_158._M_string_length = local_98._M_allocated_capacity;
      local_158.field_2._M_allocated_capacity = 0;
      local_138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (suffix->_M_dataplus)._M_p;
      local_158.field_2._8_8_ = suffix->_M_string_length;
      local_130 = 0;
      views_04._M_len = 2;
      views_04._M_array = (iterator)&local_158;
      cmCatViews((string *)local_110,views_04);
      cVar9 = GetProperty(this,(string *)local_110);
      loc->Value = (string *)cVar9;
      if (bVar8 != false) {
        local_158._M_dataplus._M_p = (pointer)0xf;
        local_158._M_string_length = 0x94712c;
        local_158.field_2._M_allocated_capacity = 0;
        local_138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (suffix->_M_dataplus)._M_p;
        local_158.field_2._8_8_ = suffix->_M_string_length;
        local_130 = 0;
        views_05._M_len = 2;
        views_05._M_array = (iterator)&local_158;
        cmCatViews((string *)local_178,views_05);
        cVar9 = GetProperty(this,(string *)local_178);
        imp->Value = (string *)cVar9;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_178 + 0x10))
        {
          operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
        }
      }
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,(ulong)(local_110._16_8_ + 1));
      }
    }
    if (imp->Value == (string *)0x0 && loc->Value == (string *)0x0) {
      suffix->_M_string_length = 0;
      *(suffix->_M_dataplus)._M_p = '\0';
      cVar9 = GetProperty(this,(string *)&local_98);
      loc->Value = (string *)cVar9;
      if (bVar8 != false) {
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"IMPORTED_IMPLIB","");
        cVar9 = GetProperty(this,&local_158);
        imp->Value = (string *)cVar9;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,
                          (ulong)(local_158.field_2._M_allocated_capacity + 1));
        }
      }
    }
    if (imp->Value == (string *)0x0 && loc->Value == (string *)0x0) {
      local_78._0_8_ = (string *)0x0;
      local_78._8_8_ = (string *)0x0;
      local_78._16_8_ = 0;
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,"IMPORTED_CONFIGURATIONS","");
      cVar9 = GetProperty(this,&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,
                        (ulong)(local_158.field_2._M_allocated_capacity + 1));
      }
      uVar6 = local_78._8_8_;
      uVar5 = local_78._0_8_;
      if (cVar9.Value != (string *)0x0) {
        if (local_78._8_8_ != local_78._0_8_) {
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_78._0_8_ + 0x10);
          do {
            plVar2 = (long *)(((string *)(paVar11 + -1))->_M_dataplus)._M_p;
            if (paVar11 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar2) {
              operator_delete(plVar2,paVar11->_M_allocated_capacity + 1);
            }
            psVar12 = (string *)(paVar11 + 1);
            paVar11 = paVar11 + 2;
          } while (psVar12 != (string *)uVar6);
          local_78._8_8_ = uVar5;
        }
        cmList::Insert((container_type *)local_78,(const_iterator)local_78._8_8_,cVar9.Value,Yes,No)
        ;
      }
      if (((loc->Value == (string *)0x0) && (imp->Value == (string *)0x0)) &&
         (local_78._0_8_ != local_78._8_8_)) {
        psVar12 = (string *)local_78._0_8_;
        do {
          cmsys::SystemTools::UpperCase((string *)local_b8,psVar12);
          local_158._M_dataplus._M_p = (pointer)0x0;
          local_158._M_string_length = 1;
          local_158.field_2._M_allocated_capacity = (long)&local_158.field_2 + 8;
          local_158.field_2._M_local_buf[8] = 0x5f;
          local_110._0_8_ = &DAT_00000001;
          local_110._16_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_110._24_8_ = local_b8._8_8_;
          local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_b8._0_8_;
          views_06._M_len = 2;
          views_06._M_array = (iterator)local_110;
          local_110._8_8_ = local_158.field_2._M_allocated_capacity;
          local_e8 = (string *)local_b8;
          cmCatViews((string *)local_178,views_06);
          std::__cxx11::string::operator=((string *)suffix,(string *)local_178);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_178 + 0x10)) {
            operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._0_8_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b8 + 0x10)
             ) {
            operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
          }
          local_158._M_dataplus._M_p = (pointer)local_98._8_8_;
          local_158._M_string_length = local_98._M_allocated_capacity;
          local_158.field_2._M_allocated_capacity = 0;
          local_138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (suffix->_M_dataplus)._M_p;
          local_158.field_2._8_8_ = suffix->_M_string_length;
          local_130 = 0;
          views_07._M_len = 2;
          views_07._M_array = (iterator)&local_158;
          cmCatViews((string *)local_110,views_07);
          cVar9 = GetProperty(this,(string *)local_110);
          loc->Value = (string *)cVar9;
          if (bVar8 != false) {
            local_158._M_dataplus._M_p = (pointer)0xf;
            local_158._M_string_length = 0x94712c;
            local_158.field_2._M_allocated_capacity = 0;
            local_138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (suffix->_M_dataplus)._M_p;
            local_158.field_2._8_8_ = suffix->_M_string_length;
            local_130 = 0;
            views_08._M_len = 2;
            views_08._M_array = (iterator)&local_158;
            cmCatViews((string *)local_178,views_08);
            cVar9 = GetProperty(this,(string *)local_178);
            imp->Value = (string *)cVar9;
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_178 + 0x10)) {
              operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
            }
          }
          if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
            operator_delete((void *)local_110._0_8_,(ulong)(local_110._16_8_ + 1));
          }
        } while (((loc->Value == (string *)0x0) && (imp->Value == (string *)0x0)) &&
                (psVar12 = psVar12 + 1, psVar12 != (string *)local_78._8_8_));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_78);
    }
    bVar8 = true;
    if (imp->Value != (string *)0x0 || loc->Value != (string *)0x0) goto LAB_003e079e;
  }
  bVar8 = ((this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType == 7;
LAB_003e079e:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_allocated_capacity != &local_88) {
    operator_delete((void *)local_98._M_allocated_capacity,
                    CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]) + 1);
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return bVar8;
}

Assistant:

bool cmTarget::GetMappedConfig(std::string const& desired_config, cmValue& loc,
                               cmValue& imp, std::string& suffix) const
{
  std::string config_upper;
  if (!desired_config.empty()) {
    config_upper = cmSystemTools::UpperCase(desired_config);
  }

  std::string locPropBase;
  if (this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    locPropBase = "IMPORTED_LIBNAME";
  } else if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    locPropBase = "IMPORTED_OBJECTS";
  } else {
    locPropBase = "IMPORTED_LOCATION";
  }

  // Track the configuration-specific property suffix.
  suffix = cmStrCat('_', config_upper);

  cmList mappedConfigs;
  {
    std::string mapProp = cmStrCat("MAP_IMPORTED_CONFIG_", config_upper);
    if (cmValue mapValue = this->GetProperty(mapProp)) {
      mappedConfigs.assign(*mapValue, cmList::EmptyElements::Yes);
    }
  }

  // If we needed to find one of the mapped configurations but did not
  // There may be only IMPORTED_IMPLIB for a shared library or an executable
  // with exports.
  bool allowImp = (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
                   this->IsExecutableWithExports()) ||
    (this->IsAIX() && this->IsExecutableWithExports()) ||
    (this->GetMakefile()->PlatformSupportsAppleTextStubs() &&
     this->IsSharedLibraryWithExports());

  // If a mapping was found, check its configurations.
  for (auto mci = mappedConfigs.begin();
       !loc && !imp && mci != mappedConfigs.end(); ++mci) {
    // Look for this configuration.
    if (mci->empty()) {
      // An empty string in the mapping has a special meaning:
      // look up the config-less properties.
      loc = this->GetProperty(locPropBase);
      if (allowImp) {
        imp = this->GetProperty("IMPORTED_IMPLIB");
      }
      // If it was found, set the suffix.
      if (loc || imp) {
        suffix.clear();
      }
    } else {
      std::string mcUpper = cmSystemTools::UpperCase(*mci);
      std::string locProp = cmStrCat(locPropBase, '_', mcUpper);
      loc = this->GetProperty(locProp);
      if (allowImp) {
        std::string impProp = cmStrCat("IMPORTED_IMPLIB_", mcUpper);
        imp = this->GetProperty(impProp);
      }

      // If it was found, use it for all properties below.
      if (loc || imp) {
        suffix = cmStrCat('_', mcUpper);
      }
    }
  }

  // If we needed to find one of the mapped configurations but did not
  // then the target location is not found.  The project does not want
  // any other configuration.
  if (!mappedConfigs.empty() && !loc && !imp) {
    // Interface libraries are always available because their
    // library name is optional so it is okay to leave loc empty.
    return this->GetType() == cmStateEnums::INTERFACE_LIBRARY;
  }

  // If we have not yet found it then there are no mapped
  // configurations.  Look for an exact-match.
  if (!loc && !imp) {
    std::string locProp = cmStrCat(locPropBase, suffix);
    loc = this->GetProperty(locProp);
    if (allowImp) {
      std::string impProp = cmStrCat("IMPORTED_IMPLIB", suffix);
      imp = this->GetProperty(impProp);
    }
  }

  // If we have not yet found it then there are no mapped
  // configurations and no exact match.
  if (!loc && !imp) {
    // The suffix computed above is not useful.
    suffix.clear();

    // Look for a configuration-less location.  This may be set by
    // manually-written code.
    loc = this->GetProperty(locPropBase);
    if (allowImp) {
      imp = this->GetProperty("IMPORTED_IMPLIB");
    }
  }

  // If we have not yet found it then the project is willing to try
  // any available configuration.
  if (!loc && !imp) {
    cmList availableConfigs;
    if (cmValue iconfigs = this->GetProperty("IMPORTED_CONFIGURATIONS")) {
      availableConfigs.assign(*iconfigs);
    }
    for (auto aci = availableConfigs.begin();
         !loc && !imp && aci != availableConfigs.end(); ++aci) {
      suffix = cmStrCat('_', cmSystemTools::UpperCase(*aci));
      std::string locProp = cmStrCat(locPropBase, suffix);
      loc = this->GetProperty(locProp);
      if (allowImp) {
        std::string impProp = cmStrCat("IMPORTED_IMPLIB", suffix);
        imp = this->GetProperty(impProp);
      }
    }
  }
  // If we have not yet found it then the target location is not available.
  if (!loc && !imp) {
    // Interface libraries are always available because their
    // library name is optional so it is okay to leave loc empty.
    return this->GetType() == cmStateEnums::INTERFACE_LIBRARY;
  }

  return true;
}